

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_clearline(_glist *x)

{
  undefined1 *puVar1;
  t_editor *ptVar2;
  
  ptVar2 = x->gl_editor;
  if ((ptVar2->field_0x88 & 0x20) == 0) {
    return;
  }
  canvas_disconnect_with_undo
            (x,(float)ptVar2->e_selectline_index1,(float)ptVar2->e_selectline_outno,
             (float)ptVar2->e_selectline_index2,(float)ptVar2->e_selectline_inno);
  puVar1 = &x->gl_editor->field_0x88;
  *puVar1 = *puVar1 & 0xdf;
  canvas_dirty(x,1.0);
  return;
}

Assistant:

static void canvas_clearline(t_canvas *x)
{
    if (x->gl_editor->e_selectedline)
    {
        canvas_disconnect_with_undo(x,
            x->gl_editor->e_selectline_index1,
            x->gl_editor->e_selectline_outno,
            x->gl_editor->e_selectline_index2,
            x->gl_editor->e_selectline_inno);
        x->gl_editor->e_selectedline = 0;
        canvas_dirty(x, 1);
    }
}